

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O0

int __thiscall
AgenPeeps::MoveInstrUp(AgenPeeps *this,Instr *instrToMove,Instr *blockStart,int bound)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *instr2;
  int local_3c;
  Instr *pIStack_38;
  int i;
  Instr *instr;
  int bound_local;
  Instr *blockStart_local;
  Instr *instrToMove_local;
  AgenPeeps *this_local;
  
  bVar2 = LowererMD::IsAssign(instrToMove);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/AgenPeeps.cpp"
                       ,0x51,"(LowererMD::IsAssign(instrToMove))",
                       "We only reschedule move instructions for now");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_3c = 1;
  if (instrToMove != blockStart) {
    instr2 = IR::Instr::GetPrevRealInstr(instrToMove);
    bVar2 = DependentInstrs(this,instrToMove,instr2);
    if (!bVar2) {
      pIStack_38 = IR::Instr::GetPrevRealInstr(instrToMove);
      IR::Instr::Unlink(instrToMove);
      while( true ) {
        bVar2 = DependentInstrs(this,instrToMove,pIStack_38);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          IR::Instr::InsertAfter(pIStack_38,instrToMove);
          return local_3c + -1;
        }
        if ((pIStack_38 == blockStart) || ((0 < bound && (local_3c == bound)))) break;
        pIStack_38 = IR::Instr::GetPrevRealInstr(pIStack_38);
        local_3c = local_3c + 1;
      }
      IR::Instr::InsertBefore(pIStack_38,instrToMove);
      return local_3c;
    }
  }
  return 0;
}

Assistant:

int AgenPeeps::MoveInstrUp(IR::Instr *instrToMove, IR::Instr *blockStart, int bound)
{
    AssertMsg(LowererMD::IsAssign(instrToMove), "We only reschedule move instructions for now");
    IR::Instr *instr;
    int i = 1;
    if (instrToMove == blockStart || DependentInstrs(instrToMove, instrToMove->GetPrevRealInstr()))
        return 0;

    instr = instrToMove->GetPrevRealInstr();
    instrToMove->Unlink();

    while (!DependentInstrs(instrToMove, instr))
    {
        if (instr == blockStart || (bound > 0 && i == bound))
        {
            instr->InsertBefore(instrToMove);
            return i;
        }
        instr = instr->GetPrevRealInstr();
        i++;
    }
    // Insert after dependent instruction
    instr->InsertAfter(instrToMove);

    return i - 1;
}